

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntConv.H
# Opt level: O0

void amrex::readIntData<unsigned_int,unsigned_int>
               (uint *data,size_t size,istream *is,IntDescriptor *id)

{
  Ordering OVar1;
  Ordering OVar2;
  IntDescriptor *this;
  IntDescriptor *in_RCX;
  char *in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t j;
  bool swapEndian;
  uint value;
  ulong local_30;
  uint32_t local_24 [3];
  char *local_18;
  ulong local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  OVar1 = IntDescriptor::order(in_RCX);
  this = FPC::NativeIntDescriptor();
  OVar2 = IntDescriptor::order(this);
  for (local_30 = 0; local_30 < local_10; local_30 = local_30 + 1) {
    std::istream::read(local_18,(long)local_24);
    if (OVar1 != OVar2) {
      local_24[0] = swapBytes(local_24[0]);
    }
    *(uint32_t *)(local_8 + local_30 * 4) = local_24[0];
  }
  return;
}

Assistant:

void readIntData (To* data, std::size_t size, std::istream& is,
                      const amrex::IntDescriptor& id)
    {
        From value;
        bool swapEndian = (id.order() != amrex::FPC::NativeIntDescriptor().order());
        for (std::size_t j = 0; j < size; ++j) {
            is.read((char*) &value, sizeof(From));
            if (swapEndian) value = swapBytes(value);
            data[j] = static_cast<To>(value);
        }
    }